

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_multi.cc
# Opt level: O1

size_t sum_count_dfs(log_multi *b,node *node)

{
  node *pnVar1;
  size_t sVar2;
  long lVar3;
  
  lVar3 = 0;
  for (; node->internal == true; node = pnVar1 + node->right) {
    pnVar1 = (b->nodes)._begin;
    sVar2 = sum_count_dfs(b,pnVar1 + node->left);
    lVar3 = lVar3 + sVar2;
  }
  return lVar3 + (ulong)node->min_count;
}

Assistant:

size_t sum_count_dfs(log_multi& b, const node& node)
{
  if (node.internal)
    return sum_count_dfs(b, b.nodes[node.left]) + sum_count_dfs(b, b.nodes[node.right]);
  else
    return node.min_count;
}